

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O1

void __thiscall
Catch::CumulativeReporterBase::
Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>::~Node
          (Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode> *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  this->_vptr_Node = (_func_int **)&PTR__Node_001bdbe0;
  std::
  vector<std::shared_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
  ::~vector(&this->children);
  pcVar1 = (this->value).stdErr._M_dataplus._M_p;
  paVar2 = &(this->value).stdErr.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->value).stdOut._M_dataplus._M_p;
  paVar2 = &(this->value).stdOut.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

virtual ~Node() {}